

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O1

void __thiscall
gss::innards::HomomorphismSearcher::HomomorphismSearcher
          (HomomorphismSearcher *this,HomomorphismModel *m,HomomorphismParams *p,
          DuplicateSolutionFilterer *d,shared_ptr<gss::innards::Proof> *f)

{
  vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  *pvVar1;
  NeedToWatch *pNVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  HomomorphismModel *pHVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  
  this->model = m;
  this->params = p;
  std::function<bool_(const_gss::innards::HomomorphismAssignments_&)>::function
            (&this->_duplicate_solution_filterer,d);
  p_Var4 = (f->super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  p_Var6 = (f->super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (f->super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var6;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (this->global_rand)._M_x[0] = 0x1571;
  uVar9 = 0x1571;
  lVar8 = 9;
  do {
    uVar9 = (ulong)((int)lVar8 + -8 + ((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965);
    (this->global_rand)._M_x[lVar8 + -8] = uVar9;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x278);
  (this->global_rand)._M_p = 0x270;
  (this->watches).nogoods.
  super__List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->watches;
  (this->watches).nogoods.
  super__List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->watches;
  (this->watches).nogoods.
  super__List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
  ._M_impl._M_node._M_size = 0;
  pvVar1 = &(this->watches).table.data;
  (pvVar1->
  super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (pvVar1->
  super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (this->watches).table.data.
  super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar2 = &(this->watches).need_to_watch;
  (this->watches).need_to_watch.
  super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pNVar2;
  (this->watches).need_to_watch.
  super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pNVar2;
  (this->watches).need_to_watch.
  super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
  ._M_impl._M_node._M_size = 0;
  pNVar2 = &(this->watches).gathered_need_to_watch;
  (this->watches).gathered_need_to_watch.
  super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pNVar2;
  (this->watches).gathered_need_to_watch.
  super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pNVar2;
  (this->watches).gathered_need_to_watch.
  super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
  ._M_impl._M_node._M_size = 0;
  bVar7 = might_have_watches(this->params);
  if (bVar7) {
    pHVar5 = this->model;
    uVar3 = pHVar5->target_size;
    (this->watches).table.target_size = uVar3;
    std::
    vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
    ::resize(&(this->watches).table.data,(ulong)(uVar3 * pHVar5->pattern_size));
  }
  return;
}

Assistant:

HomomorphismSearcher::HomomorphismSearcher(const HomomorphismModel & m, const HomomorphismParams & p,
    const DuplicateSolutionFilterer & d, const std::shared_ptr<Proof> & f) :
    model(m),
    params(p),
    _duplicate_solution_filterer(d),
    proof(f)
{
    if (might_have_watches(params)) {
        watches.table.target_size = model.target_size;
        watches.table.data.resize(model.pattern_size * model.target_size);
    }
}